

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::DiscMiMBIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  undefined8 *puVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  float fVar34;
  float fVar35;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar67;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  float fVar77;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar66 [64];
  
  pSVar6 = context->scene;
  uVar22 = Disc->sharedGeomID;
  pGVar7 = (pSVar6->geometries).items[uVar22].ptr;
  fVar1 = (pGVar7->time_range).lower;
  fVar1 = pGVar7->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar7->time_range).upper - fVar1));
  auVar97 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar97 = vminss_avx(auVar97,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar97 = vmaxss_avx(ZEXT816(0) << 0x20,auVar97);
  uVar24 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar8 = *(long *)&pGVar7[2].numPrimitives;
  lVar28 = (long)(int)auVar97._0_4_ * 0x38;
  lVar9 = *(long *)(lVar8 + lVar28);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar28);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar29 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar30 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar52._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar27);
  auVar52._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar24);
  uVar31 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar31);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar33);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar32);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar29);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar60._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar23);
  auVar60._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar30);
  lVar9 = *(long *)(lVar8 + 0x38 + lVar28);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar28);
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar27 * lVar8);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar24 * lVar8);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar31 * lVar8);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar33 * lVar8);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar32 * lVar8);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar29 * lVar8);
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar23);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar30 * lVar8);
  fVar1 = fVar1 - auVar97._0_4_;
  auVar58 = vunpcklps_avx(auVar52,auVar56);
  local_2e0 = vunpckhps_avx(auVar52,auVar56);
  auVar14 = vunpcklps_avx(auVar55,auVar60);
  auVar60 = vunpckhps_avx(auVar55,auVar60);
  auVar52 = vunpcklps_avx(auVar58,auVar14);
  auVar58 = vunpckhps_avx(auVar58,auVar14);
  auVar55 = vunpcklps_avx(local_2e0,auVar60);
  auVar14 = vunpcklps_avx(auVar62,auVar68);
  auVar62 = vunpckhps_avx(auVar62,auVar68);
  auVar56 = vunpcklps_avx(auVar64,auVar78);
  auVar64 = vunpckhps_avx(auVar64,auVar78);
  auVar59 = vunpcklps_avx(auVar14,auVar56);
  auVar14 = vunpckhps_avx(auVar14,auVar56);
  auVar56 = vunpcklps_avx(auVar62,auVar64);
  auVar97 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar13 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = &DAT_3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar96._16_4_ = 0x3f800000;
  auVar96._20_4_ = 0x3f800000;
  auVar96._24_4_ = 0x3f800000;
  auVar96._28_4_ = 0x3f800000;
  fVar12 = auVar97._0_4_;
  fVar48 = auVar97._4_4_;
  fVar50 = auVar97._8_4_;
  fVar44 = auVar97._12_4_;
  fVar46 = auVar13._0_4_;
  fVar86 = auVar13._4_4_;
  fVar87 = auVar13._8_4_;
  fVar88 = auVar13._12_4_;
  auVar57._0_4_ = auVar59._0_4_ * fVar12 + fVar46 * auVar52._0_4_;
  auVar57._4_4_ = auVar59._4_4_ * fVar48 + fVar86 * auVar52._4_4_;
  auVar57._8_4_ = auVar59._8_4_ * fVar50 + fVar87 * auVar52._8_4_;
  auVar57._12_4_ = auVar59._12_4_ * fVar44 + fVar88 * auVar52._12_4_;
  auVar57._16_4_ = auVar59._16_4_ * fVar12 + fVar46 * auVar52._16_4_;
  auVar57._20_4_ = auVar59._20_4_ * fVar48 + fVar86 * auVar52._20_4_;
  auVar57._24_4_ = auVar59._24_4_ * fVar50 + fVar87 * auVar52._24_4_;
  auVar57._28_4_ = auVar59._28_4_ + auVar52._28_4_;
  auVar61._0_4_ = fVar46 * auVar58._0_4_ + fVar12 * auVar14._0_4_;
  auVar61._4_4_ = fVar86 * auVar58._4_4_ + fVar48 * auVar14._4_4_;
  auVar61._8_4_ = fVar87 * auVar58._8_4_ + fVar50 * auVar14._8_4_;
  auVar61._12_4_ = fVar88 * auVar58._12_4_ + fVar44 * auVar14._12_4_;
  auVar61._16_4_ = fVar46 * auVar58._16_4_ + fVar12 * auVar14._16_4_;
  auVar61._20_4_ = fVar86 * auVar58._20_4_ + fVar48 * auVar14._20_4_;
  auVar61._24_4_ = fVar87 * auVar58._24_4_ + fVar50 * auVar14._24_4_;
  auVar61._28_4_ = auVar58._28_4_ + auVar14._28_4_;
  local_250 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
  local_260 = local_250;
  uVar2 = *(undefined4 *)(ray + k * 4);
  auVar69._4_4_ = uVar2;
  auVar69._0_4_ = uVar2;
  auVar69._8_4_ = uVar2;
  auVar69._12_4_ = uVar2;
  auVar69._16_4_ = uVar2;
  auVar69._20_4_ = uVar2;
  auVar69._24_4_ = uVar2;
  auVar69._28_4_ = uVar2;
  auVar63._0_4_ = auVar56._0_4_ * fVar12 + fVar46 * auVar55._0_4_;
  auVar63._4_4_ = auVar56._4_4_ * fVar48 + fVar86 * auVar55._4_4_;
  auVar63._8_4_ = auVar56._8_4_ * fVar50 + fVar87 * auVar55._8_4_;
  auVar63._12_4_ = auVar56._12_4_ * fVar44 + fVar88 * auVar55._12_4_;
  auVar63._16_4_ = auVar56._16_4_ * fVar12 + fVar46 * auVar55._16_4_;
  auVar63._20_4_ = auVar56._20_4_ * fVar48 + fVar86 * auVar55._20_4_;
  auVar63._24_4_ = auVar56._24_4_ * fVar50 + fVar87 * auVar55._24_4_;
  auVar63._28_4_ = auVar56._28_4_ + auVar14._28_4_;
  auVar52 = vsubps_avx(auVar57,auVar69);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar58._4_4_ = uVar2;
  auVar58._0_4_ = uVar2;
  auVar58._8_4_ = uVar2;
  auVar58._12_4_ = uVar2;
  auVar58._16_4_ = uVar2;
  auVar58._20_4_ = uVar2;
  auVar58._24_4_ = uVar2;
  auVar58._28_4_ = uVar2;
  auVar55 = vsubps_avx(auVar61,auVar58);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar59._4_4_ = uVar2;
  auVar59._0_4_ = uVar2;
  auVar59._8_4_ = uVar2;
  auVar59._12_4_ = uVar2;
  auVar59._16_4_ = uVar2;
  auVar59._20_4_ = uVar2;
  auVar59._24_4_ = uVar2;
  auVar59._28_4_ = uVar2;
  auVar56 = vsubps_avx(auVar63,auVar59);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar97 = ZEXT416((uint)(fVar1 * fVar1 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  auVar98._16_16_ = auVar97;
  auVar98._0_16_ = auVar97;
  auVar58 = vrcpps_avx(auVar98);
  fVar34 = auVar58._0_4_;
  fVar39 = auVar58._4_4_;
  auVar14._4_4_ = fVar39 * auVar97._4_4_;
  auVar14._0_4_ = fVar34 * auVar97._0_4_;
  fVar41 = auVar58._8_4_;
  auVar14._8_4_ = fVar41 * auVar97._8_4_;
  fVar43 = auVar58._12_4_;
  auVar14._12_4_ = fVar43 * auVar97._12_4_;
  fVar45 = auVar58._16_4_;
  auVar14._16_4_ = fVar45 * auVar97._0_4_;
  fVar47 = auVar58._20_4_;
  auVar14._20_4_ = fVar47 * auVar97._4_4_;
  fVar49 = auVar58._24_4_;
  auVar14._24_4_ = fVar49 * auVar97._8_4_;
  auVar14._28_4_ = auVar97._12_4_;
  auVar58 = vsubps_avx(auVar96,auVar14);
  fVar89 = auVar56._0_4_;
  fVar90 = auVar56._4_4_;
  fVar91 = auVar56._8_4_;
  fVar92 = auVar56._12_4_;
  fVar93 = auVar56._16_4_;
  fVar94 = auVar56._20_4_;
  fVar95 = auVar56._24_4_;
  fVar77 = auVar55._0_4_;
  fVar80 = auVar55._4_4_;
  fVar81 = auVar55._8_4_;
  fVar82 = auVar55._12_4_;
  fVar83 = auVar55._16_4_;
  fVar84 = auVar55._20_4_;
  fVar85 = auVar55._24_4_;
  fVar67 = auVar52._0_4_;
  fVar71 = auVar52._4_4_;
  fVar72 = auVar52._8_4_;
  fVar73 = auVar52._12_4_;
  fVar74 = auVar52._16_4_;
  fVar75 = auVar52._20_4_;
  fVar76 = auVar52._24_4_;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar101._4_4_ = uVar2;
  auVar101._0_4_ = uVar2;
  auVar101._8_4_ = uVar2;
  auVar101._12_4_ = uVar2;
  auVar101._16_4_ = uVar2;
  auVar101._20_4_ = uVar2;
  auVar101._24_4_ = uVar2;
  auVar101._28_4_ = uVar2;
  fVar34 = (fVar67 * fVar1 + fVar77 * fVar3 + fVar89 * fVar4) * (fVar34 + fVar34 * auVar58._0_4_);
  fVar39 = (fVar71 * fVar1 + fVar80 * fVar3 + fVar90 * fVar4) * (fVar39 + fVar39 * auVar58._4_4_);
  local_200._4_4_ = fVar39;
  local_200._0_4_ = fVar34;
  fVar41 = (fVar72 * fVar1 + fVar81 * fVar3 + fVar91 * fVar4) * (fVar41 + fVar41 * auVar58._8_4_);
  local_200._8_4_ = fVar41;
  fVar43 = (fVar73 * fVar1 + fVar82 * fVar3 + fVar92 * fVar4) * (fVar43 + fVar43 * auVar58._12_4_);
  local_200._12_4_ = fVar43;
  fVar45 = (fVar74 * fVar1 + fVar83 * fVar3 + fVar93 * fVar4) * (fVar45 + fVar45 * auVar58._16_4_);
  local_200._16_4_ = fVar45;
  fVar47 = (fVar75 * fVar1 + fVar84 * fVar3 + fVar94 * fVar4) * (fVar47 + fVar47 * auVar58._20_4_);
  local_200._20_4_ = fVar47;
  fVar49 = (fVar76 * fVar1 + fVar85 * fVar3 + fVar95 * fVar4) * (fVar49 + fVar49 * auVar58._24_4_);
  local_200._24_4_ = fVar49;
  local_200._28_4_ = local_2e0._28_4_;
  auVar58 = vcmpps_avx(auVar101,local_200,2);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar99._4_4_ = uVar2;
  auVar99._0_4_ = uVar2;
  auVar99._8_4_ = uVar2;
  auVar99._12_4_ = uVar2;
  auVar99._16_4_ = uVar2;
  auVar99._20_4_ = uVar2;
  auVar99._24_4_ = uVar2;
  auVar99._28_4_ = uVar2;
  auVar14 = vcmpps_avx(local_200,auVar99,2);
  auVar58 = vandps_avx(auVar58,auVar14);
  auVar97 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar100._16_16_ = auVar97;
  auVar100._0_16_ = auVar97;
  auVar14 = vcvtdq2ps_avx(auVar100);
  auVar14 = vcmpps_avx(_DAT_02020f40,auVar14,1);
  auVar59 = auVar14 & auVar58;
  if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar59 >> 0x7f,0) != '\0') ||
        (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar59 >> 0xbf,0) != '\0') ||
      (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar59[0x1f] < '\0') {
    auVar102 = ZEXT3264(local_200);
    auVar58 = vandps_avx(auVar58,auVar14);
    auVar14 = vunpckhps_avx(local_2e0,auVar60);
    auVar60 = vunpckhps_avx(auVar62,auVar64);
    fVar35 = fVar46 * auVar14._0_4_ + fVar12 * auVar60._0_4_;
    fVar40 = fVar86 * auVar14._4_4_ + fVar48 * auVar60._4_4_;
    fVar42 = fVar87 * auVar14._8_4_ + fVar50 * auVar60._8_4_;
    fVar44 = fVar88 * auVar14._12_4_ + fVar44 * auVar60._12_4_;
    fVar46 = fVar46 * auVar14._16_4_ + fVar12 * auVar60._16_4_;
    fVar48 = fVar86 * auVar14._20_4_ + fVar48 * auVar60._20_4_;
    fVar50 = fVar87 * auVar14._24_4_ + fVar50 * auVar60._24_4_;
    auVar15._4_4_ = fVar39 * fVar1;
    auVar15._0_4_ = fVar34 * fVar1;
    auVar15._8_4_ = fVar41 * fVar1;
    auVar15._12_4_ = fVar43 * fVar1;
    auVar15._16_4_ = fVar45 * fVar1;
    auVar15._20_4_ = fVar47 * fVar1;
    auVar15._24_4_ = fVar49 * fVar1;
    auVar15._28_4_ = auVar60._28_4_;
    auVar16._4_4_ = fVar39 * fVar3;
    auVar16._0_4_ = fVar34 * fVar3;
    auVar16._8_4_ = fVar41 * fVar3;
    auVar16._12_4_ = fVar43 * fVar3;
    auVar16._16_4_ = fVar45 * fVar3;
    auVar16._20_4_ = fVar47 * fVar3;
    auVar16._24_4_ = fVar49 * fVar3;
    auVar16._28_4_ = auVar62._28_4_;
    auVar17._4_4_ = fVar39 * fVar4;
    auVar17._0_4_ = fVar34 * fVar4;
    auVar17._8_4_ = fVar41 * fVar4;
    auVar17._12_4_ = fVar43 * fVar4;
    auVar17._16_4_ = fVar45 * fVar4;
    auVar17._20_4_ = fVar47 * fVar4;
    auVar17._24_4_ = fVar49 * fVar4;
    auVar17._28_4_ = auVar64._28_4_;
    auVar14 = vsubps_avx(auVar52,auVar15);
    auVar52 = vsubps_avx(auVar55,auVar16);
    auVar55 = vsubps_avx(auVar56,auVar17);
    fVar12 = auVar55._28_4_;
    auVar53._0_4_ =
         auVar14._0_4_ * auVar14._0_4_ +
         auVar52._0_4_ * auVar52._0_4_ + auVar55._0_4_ * auVar55._0_4_;
    auVar53._4_4_ =
         auVar14._4_4_ * auVar14._4_4_ +
         auVar52._4_4_ * auVar52._4_4_ + auVar55._4_4_ * auVar55._4_4_;
    auVar53._8_4_ =
         auVar14._8_4_ * auVar14._8_4_ +
         auVar52._8_4_ * auVar52._8_4_ + auVar55._8_4_ * auVar55._8_4_;
    auVar53._12_4_ =
         auVar14._12_4_ * auVar14._12_4_ +
         auVar52._12_4_ * auVar52._12_4_ + auVar55._12_4_ * auVar55._12_4_;
    auVar53._16_4_ =
         auVar14._16_4_ * auVar14._16_4_ +
         auVar52._16_4_ * auVar52._16_4_ + auVar55._16_4_ * auVar55._16_4_;
    auVar53._20_4_ =
         auVar14._20_4_ * auVar14._20_4_ +
         auVar52._20_4_ * auVar52._20_4_ + auVar55._20_4_ * auVar55._20_4_;
    auVar53._24_4_ =
         auVar14._24_4_ * auVar14._24_4_ +
         auVar52._24_4_ * auVar52._24_4_ + auVar55._24_4_ * auVar55._24_4_;
    auVar53._28_4_ = auVar14._28_4_ + auVar52._28_4_ + fVar12;
    auVar18._4_4_ = fVar40 * fVar40;
    auVar18._0_4_ = fVar35 * fVar35;
    auVar18._8_4_ = fVar42 * fVar42;
    auVar18._12_4_ = fVar44 * fVar44;
    auVar18._16_4_ = fVar46 * fVar46;
    auVar18._20_4_ = fVar48 * fVar48;
    auVar18._24_4_ = fVar50 * fVar50;
    auVar18._28_4_ = auVar14._28_4_;
    auVar14 = vcmpps_avx(auVar53,auVar18,2);
    auVar52 = auVar58 & auVar14;
    if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar52 >> 0x7f,0) != '\0') ||
          (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar52 >> 0xbf,0) != '\0') ||
        (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar52[0x1f] < '\0')
    {
      auVar58 = vandps_avx(auVar58,auVar14);
      auVar54._0_4_ = fVar67 * fVar67 + fVar77 * fVar77 + fVar89 * fVar89;
      auVar54._4_4_ = fVar71 * fVar71 + fVar80 * fVar80 + fVar90 * fVar90;
      auVar54._8_4_ = fVar72 * fVar72 + fVar81 * fVar81 + fVar91 * fVar91;
      auVar54._12_4_ = fVar73 * fVar73 + fVar82 * fVar82 + fVar92 * fVar92;
      auVar54._16_4_ = fVar74 * fVar74 + fVar83 * fVar83 + fVar93 * fVar93;
      auVar54._20_4_ = fVar75 * fVar75 + fVar84 * fVar84 + fVar94 * fVar94;
      auVar54._24_4_ = fVar76 * fVar76 + fVar85 * fVar85 + fVar95 * fVar95;
      auVar54._28_4_ = fVar12 + fVar12 + auVar53._28_4_;
      auVar14 = vcmpps_avx(auVar54,auVar18,6);
      auVar52 = auVar58 & auVar14;
      if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar52 >> 0x7f,0) != '\0') ||
            (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar52 >> 0xbf,0) != '\0') ||
          (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar52[0x1f] < '\0') {
        local_2a0 = vandps_avx(auVar14,auVar58);
        local_220 = ZEXT832(0) << 0x20;
        local_240 = ZEXT832(0) << 0x20;
        local_1e0[0] = -fVar1;
        local_1e0[1] = -fVar1;
        local_1e0[2] = -fVar1;
        local_1e0[3] = -fVar1;
        fStack_1d0 = -fVar1;
        fStack_1cc = -fVar1;
        fStack_1c8 = -fVar1;
        fStack_1c4 = -fVar1;
        local_1c0[0] = -fVar3;
        local_1c0[1] = -fVar3;
        local_1c0[2] = -fVar3;
        local_1c0[3] = -fVar3;
        fStack_1b0 = -fVar3;
        fStack_1ac = -fVar3;
        fStack_1a8 = -fVar3;
        fStack_1a4 = -fVar3;
        local_1a0[0] = -fVar4;
        local_1a0[1] = -fVar4;
        local_1a0[2] = -fVar4;
        local_1a0[3] = -fVar4;
        fStack_190 = -fVar4;
        fStack_18c = -fVar4;
        fStack_188 = -fVar4;
        fStack_184 = -fVar4;
        auVar65._8_4_ = 0x7f800000;
        auVar65._0_8_ = 0x7f8000007f800000;
        auVar65._12_4_ = 0x7f800000;
        auVar65._16_4_ = 0x7f800000;
        auVar65._20_4_ = 0x7f800000;
        auVar65._24_4_ = 0x7f800000;
        auVar65._28_4_ = 0x7f800000;
        auVar66 = ZEXT3264(auVar65);
        auVar58 = vblendvps_avx(auVar65,local_200,local_2a0);
        auVar14 = vshufps_avx(auVar58,auVar58,0xb1);
        auVar14 = vminps_avx(auVar58,auVar14);
        auVar52 = vshufpd_avx(auVar14,auVar14,5);
        auVar14 = vminps_avx(auVar14,auVar52);
        auVar52 = vperm2f128_avx(auVar14,auVar14,1);
        auVar14 = vminps_avx(auVar14,auVar52);
        auVar14 = vcmpps_avx(auVar58,auVar14,0);
        auVar52 = local_2a0 & auVar14;
        auVar58 = local_2a0;
        if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0x7f,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar52 >> 0xbf,0) != '\0') ||
            (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar52[0x1f] < '\0') {
          auVar58 = vandps_avx(auVar14,local_2a0);
        }
        uVar21 = vmovmskps_avx(auVar58);
        uVar25 = 1 << ((byte)k & 0x1f);
        uVar22 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar23 = (ulong)((uVar25 & 0xf) << 4);
        puVar26 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar25 >> 4) * 0x10);
        auVar58 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar70 = ZEXT3264(auVar58);
        auVar79 = ZEXT864(0) << 0x20;
        do {
          local_310.hit = local_180;
          local_310.valid = (int *)&local_340;
          uVar24 = (ulong)uVar22;
          uVar22 = *(uint *)(local_260 + uVar24 * 4);
          pGVar7 = (pSVar6->geometries).items[uVar22].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_2a0 + uVar24 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar2 = *(undefined4 *)(local_240 + uVar24 * 4);
              uVar5 = *(undefined4 *)(local_220 + uVar24 * 4);
              *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar24 - 8];
              *(float *)(ray + k * 4 + 0x180) = local_1e0[uVar24];
              *(float *)(ray + k * 4 + 0x1a0) = local_1c0[uVar24];
              *(float *)(ray + k * 4 + 0x1c0) = local_1a0[uVar24];
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
              *(uint *)(ray + k * 4 + 0x220) = (Disc->primIDs).field_0.i[uVar24];
              *(uint *)(ray + k * 4 + 0x240) = uVar22;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_240 + uVar24 * 4);
            local_100 = *(undefined4 *)(local_220 + uVar24 * 4);
            local_e0 = (Disc->primIDs).field_0.i[uVar24];
            fVar1 = local_1e0[uVar24];
            fVar3 = local_1c0[uVar24];
            local_160._4_4_ = fVar3;
            local_160._0_4_ = fVar3;
            local_160._8_4_ = fVar3;
            local_160._12_4_ = fVar3;
            local_160._16_4_ = fVar3;
            local_160._20_4_ = fVar3;
            local_160._24_4_ = fVar3;
            local_160._28_4_ = fVar3;
            auStack_b0 = vpshufd_avx(ZEXT416(uVar22),0);
            fVar3 = local_1a0[uVar24];
            local_140._4_4_ = fVar3;
            local_140._0_4_ = fVar3;
            local_140._8_4_ = fVar3;
            local_140._12_4_ = fVar3;
            local_140._16_4_ = fVar3;
            local_140._20_4_ = fVar3;
            local_140._24_4_ = fVar3;
            local_140._28_4_ = fVar3;
            local_180[0] = (RTCHitN)SUB41(fVar1,0);
            local_180[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[4] = (RTCHitN)SUB41(fVar1,0);
            local_180[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[8] = (RTCHitN)SUB41(fVar1,0);
            local_180[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0xc] = (RTCHitN)SUB41(fVar1,0);
            local_180[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x10] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x11] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x14] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x15] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x18] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x19] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x1c] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x1d] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            local_280 = auVar70._0_32_;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar24 - 8];
            local_340 = *(undefined8 *)(mm_lookupmask_ps + uVar23);
            uStack_338 = *(undefined8 *)(mm_lookupmask_ps + uVar23 + 8);
            local_330 = *puVar26;
            uStack_328 = puVar26[1];
            local_310.geometryUserPtr = pGVar7->userPtr;
            local_310.context = context->user;
            local_310.N = 8;
            local_310.ray = (RTCRayN *)ray;
            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              local_2c0 = auVar102._0_32_;
              local_2e0._0_8_ = puVar26;
              (*pGVar7->intersectionFilterN)(&local_310);
              auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar70 = ZEXT3264(local_280);
              auVar66 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar102 = ZEXT3264(local_2c0);
              puVar26 = (undefined8 *)local_2e0._0_8_;
            }
            auVar97._8_8_ = uStack_338;
            auVar97._0_8_ = local_340;
            auVar97 = vpcmpeqd_avx(auVar79._0_16_,auVar97);
            auVar13._8_8_ = uStack_328;
            auVar13._0_8_ = local_330;
            auVar13 = vpcmpeqd_avx(auVar79._0_16_,auVar13);
            auVar36._16_16_ = auVar13;
            auVar36._0_16_ = auVar97;
            local_280 = auVar70._0_32_;
            auVar58 = local_280 & ~auVar36;
            if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar58 >> 0x7f,0) == '\0') &&
                  (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar58 >> 0xbf,0) == '\0') &&
                (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar58[0x1f]) {
              auVar37._0_4_ = auVar70._0_4_ ^ auVar97._0_4_;
              auVar37._4_4_ = auVar70._4_4_ ^ auVar97._4_4_;
              auVar37._8_4_ = auVar70._8_4_ ^ auVar97._8_4_;
              auVar37._12_4_ = auVar70._12_4_ ^ auVar97._12_4_;
              auVar37._16_4_ = auVar70._16_4_ ^ auVar13._0_4_;
              auVar37._20_4_ = auVar70._20_4_ ^ auVar13._4_4_;
              auVar37._24_4_ = auVar70._24_4_ ^ auVar13._8_4_;
              auVar37._28_4_ = auVar70._28_4_ ^ auVar13._12_4_;
            }
            else {
              p_Var11 = context->args->filter;
              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                local_2c0 = auVar102._0_32_;
                local_2e0._0_8_ = puVar26;
                (*p_Var11)(&local_310);
                auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar70 = ZEXT3264(local_280);
                auVar66 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar102 = ZEXT3264(local_2c0);
                puVar26 = (undefined8 *)local_2e0._0_8_;
              }
              auVar19._8_8_ = uStack_338;
              auVar19._0_8_ = local_340;
              auVar97 = vpcmpeqd_avx(auVar79._0_16_,auVar19);
              auVar20._8_8_ = uStack_328;
              auVar20._0_8_ = local_330;
              auVar13 = vpcmpeqd_avx(auVar79._0_16_,auVar20);
              auVar51._16_16_ = auVar13;
              auVar51._0_16_ = auVar97;
              auVar37._0_4_ = auVar70._0_4_ ^ auVar97._0_4_;
              auVar37._4_4_ = auVar70._4_4_ ^ auVar97._4_4_;
              auVar37._8_4_ = auVar70._8_4_ ^ auVar97._8_4_;
              auVar37._12_4_ = auVar70._12_4_ ^ auVar97._12_4_;
              auVar37._16_4_ = auVar70._16_4_ ^ auVar13._0_4_;
              auVar37._20_4_ = auVar70._20_4_ ^ auVar13._4_4_;
              auVar37._24_4_ = auVar70._24_4_ ^ auVar13._8_4_;
              auVar37._28_4_ = auVar70._28_4_ ^ auVar13._12_4_;
              auVar58 = auVar70._0_32_ & ~auVar51;
              if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar58 >> 0x7f,0) != '\0') ||
                    (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar58 >> 0xbf,0) != '\0') ||
                  (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar58[0x1f] < '\0') {
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])local_310.hit);
                *(undefined1 (*) [32])(local_310.ray + 0x180) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0x20));
                *(undefined1 (*) [32])(local_310.ray + 0x1a0) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0x40));
                *(undefined1 (*) [32])(local_310.ray + 0x1c0) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0x60));
                *(undefined1 (*) [32])(local_310.ray + 0x1e0) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0x80));
                *(undefined1 (*) [32])(local_310.ray + 0x200) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0xa0));
                *(undefined1 (*) [32])(local_310.ray + 0x220) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0xc0));
                *(undefined1 (*) [32])(local_310.ray + 0x240) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0xe0));
                *(undefined1 (*) [32])(local_310.ray + 0x260) = auVar58;
                auVar58 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_310.hit + 0x100));
                *(undefined1 (*) [32])(local_310.ray + 0x280) = auVar58;
              }
            }
            if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar37 >> 0x7f,0) == '\0') &&
                  (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0xbf,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar37[0x1f]) {
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
            }
            *(undefined4 *)(local_2a0 + uVar24 * 4) = 0;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar38._4_4_ = uVar2;
            auVar38._0_4_ = uVar2;
            auVar38._8_4_ = uVar2;
            auVar38._12_4_ = uVar2;
            auVar38._16_4_ = uVar2;
            auVar38._20_4_ = uVar2;
            auVar38._24_4_ = uVar2;
            auVar38._28_4_ = uVar2;
            auVar58 = vcmpps_avx(auVar102._0_32_,auVar38,2);
            local_2a0 = vandps_avx(auVar58,local_2a0);
          }
          if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_2a0 >> 0x7f,0) == '\0') &&
                (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_2a0 >> 0xbf,0) == '\0') &&
              (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_2a0[0x1f]) {
            return;
          }
          auVar58 = vblendvps_avx(auVar66._0_32_,auVar102._0_32_,local_2a0);
          auVar14 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar14 = vminps_avx(auVar58,auVar14);
          auVar52 = vshufpd_avx(auVar14,auVar14,5);
          auVar14 = vminps_avx(auVar14,auVar52);
          auVar52 = vperm2f128_avx(auVar14,auVar14,1);
          auVar14 = vminps_avx(auVar14,auVar52);
          auVar14 = vcmpps_avx(auVar58,auVar14,0);
          auVar52 = local_2a0 & auVar14;
          auVar58 = local_2a0;
          if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar52 >> 0x7f,0) != '\0') ||
                (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0xbf,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar52[0x1f] < '\0') {
            auVar58 = vandps_avx(auVar14,local_2a0);
          }
          uVar21 = vmovmskps_avx(auVar58);
          uVar22 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }